

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase321::run(TestCase321 *this)

{
  Builder builder_00;
  Reader reader_00;
  size_t sVar1;
  size_t sVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  ArrayPtr<const_unsigned_char> packedBytes;
  ReaderOptions options;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  Reader local_348;
  ArrayPtr<capnp::word> local_318;
  ReaderOptions local_308;
  undefined1 local_2f8 [8];
  PackedMessageReader reader;
  size_t local_1a8;
  size_t local_1a0;
  bool local_191;
  undefined1 auStack_190 [7];
  bool _kj_shouldLog;
  size_t local_188;
  undefined1 local_180 [8];
  TestPipe pipe;
  Builder local_130;
  undefined1 local_108 [8];
  TestMessageBuilder builder;
  TestCase321 *this_local;
  
  builder._240_8_ = this;
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)local_108,10);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_130,(MessageBuilder *)local_108);
  builder_00._builder.capTable = (CapTableBuilder *)local_130._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_130._builder.capTable;
  builder_00._builder.data = local_130._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_130._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffc60;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffc60 >> 0x30);
  initTestMessage(builder_00);
  TestPipe::TestPipe((TestPipe *)local_180);
  writePackedMessage((OutputStream *)&pipe,(MessageBuilder *)local_108);
  sVar1 = computeSerializedSizeInWords((MessageBuilder *)local_108);
  _auStack_190 = TestPipe::getArray((TestPipe *)local_180);
  AVar3.size_ = (uchar *)auStack_190._8_8_;
  AVar3.ptr = AVar3.size_;
  sVar2 = computeUnpackedSizeInWords((capnp *)auStack_190._0_8_,AVar3);
  if (sVar1 != sVar2) {
    local_191 = kj::_::Debug::shouldLog(ERROR);
    while (local_191 != false) {
      local_1a0 = computeSerializedSizeInWords((MessageBuilder *)local_108);
      AVar3 = TestPipe::getArray((TestPipe *)local_180);
      packedBytes.size_ = (uchar *)AVar3.size_;
      reader.super_InputStreamMessageReader._296_8_ = AVar3.ptr;
      packedBytes.ptr = packedBytes.size_;
      local_1a8 = computeUnpackedSizeInWords
                            ((capnp *)reader.super_InputStreamMessageReader._296_8_,packedBytes);
      kj::_::Debug::log<char_const(&)[106],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
                 ,0x148,ERROR,
                 "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
                 ,(char (*) [106])
                  "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
                 ,&local_1a0,&local_1a8);
      local_191 = false;
    }
  }
  local_308.traversalLimitInWords = 0;
  local_308.nestingLimit = 0;
  local_308._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_308);
  kj::ArrayPtr<capnp::word>::ArrayPtr(&local_318,(void *)0x0);
  options.nestingLimit = local_308.nestingLimit;
  options.traversalLimitInWords = local_308.traversalLimitInWords;
  options._12_4_ = 0;
  PackedMessageReader::PackedMessageReader
            ((PackedMessageReader *)local_2f8,(BufferedInputStream *)local_180,options,local_318);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_348,(MessageReader *)&reader.super_PackedInputStream.inner);
  reader_00._reader.capTable = (CapTableReader *)local_348._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_348._reader.capTable;
  reader_00._reader.data = local_348._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_348._reader._32_8_;
  reader_00._reader.dataSize = local_348._reader.nestingLimit;
  reader_00._reader.pointerCount = local_348._reader._44_2_;
  reader_00._reader._38_2_ = local_348._reader._46_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffc68;
  checkTestMessage(reader_00);
  PackedMessageReader::~PackedMessageReader((PackedMessageReader *)local_2f8);
  TestPipe::~TestPipe((TestPipe *)local_180);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)local_108);
  return;
}

Assistant:

TEST(Orphans, ListAnyPointer) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint32_t>>({12, 34, 56});
  EXPECT_TRUE(root.hasAnyPointerField());

  Orphan<List<uint32_t>> orphan = root.getAnyPointerField().disownAs<List<uint32_t>>();
  EXPECT_FALSE(orphan == nullptr);

  checkList(orphan.getReader(), {12u, 34u, 56u});
  EXPECT_FALSE(root.hasAnyPointerField());

  root.getAnyPointerField().adopt(kj::mv(orphan));
  EXPECT_TRUE(orphan == nullptr);
  EXPECT_TRUE(root.hasAnyPointerField());
  checkList(root.asReader().getAnyPointerField().getAs<List<uint32_t>>(), {12u, 34u, 56u});
}